

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::iteratorAccessTest<true>(ViewTest *this)

{
  int *piVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar7;
  reference piVar8;
  logic_error *plVar9;
  code *pcVar10;
  int iVar11;
  ulong uVar12;
  undefined *puVar13;
  long lVar14;
  value_type *__val;
  iterator it;
  reverse_iterator it_1;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_108;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_d8;
  undefined1 local_a8 [16];
  size_t *local_98;
  size_t local_80;
  size_t local_78;
  reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_> local_68;
  
  _Var6._M_current = (unsigned_long *)operator_new(8);
  *_Var6._M_current = 0x18;
  piVar1 = this->data_;
  local_a8._0_8_ = piVar1;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_108);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
  local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.index_ = 0;
  local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.view_ = (view_pointer)0x0;
  local_108.pointer_ = (pointer)0x0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_108);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
  puVar4 = local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar3 = local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_108.view_ = local_d8.view_;
  local_108.pointer_ = local_d8.pointer_;
  local_108.index_ = local_d8.index_;
  local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
  }
  if (local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar14 = 1;
  do {
    if ((local_108.view_ == (view_pointer)0x0) ||
       (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
      pcVar10 = std::runtime_error::~runtime_error;
      puVar13 = &std::runtime_error::typeinfo;
LAB_001a341b:
      __cxa_throw(plVar9,puVar13,pcVar10);
    }
    if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar9,"test failed.");
      pcVar10 = std::logic_error::~logic_error;
      puVar13 = &std::logic_error::typeinfo;
      goto LAB_001a341b;
    }
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_108);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x19);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,local_78);
  if (local_108.view_ == (view_pointer)0x0) {
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
  }
  else {
    if (local_d8.view_ == local_108.view_) {
      if (local_108.index_ == local_d8.index_) {
        if (local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&local_108)
        ;
        if ((pIVar7->view_ == (view_pointer)0x0) ||
           ((pIVar7->view_->geometry_).size_ <= pIVar7->index_)) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          pcVar10 = std::runtime_error::~runtime_error;
          puVar13 = &std::runtime_error::typeinfo;
LAB_001a3773:
          __cxa_throw(plVar9,puVar13,pcVar10);
        }
        if (*pIVar7->pointer_ != 0x17) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar13 = &std::logic_error::typeinfo;
          goto LAB_001a3773;
        }
        if (local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        operator_delete(local_98,local_80 * 0x18);
        operator_delete(_Var6._M_current,8);
        _Var6._M_current = (unsigned_long *)operator_new(8);
        *_Var6._M_current = 0x18;
        local_a8._0_8_ = piVar1;
        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var6,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )(_Var6._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                   (allocator_type *)&local_108);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
        std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
        reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                          *)&local_d8);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                  (&local_108,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,local_78);
        pvVar2 = &local_68.current.coordinates_;
        local_68.current.index_ = local_108.index_;
        local_68.current.view_ = local_108.view_;
        local_68.current.pointer_ = local_108.pointer_;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (pvVar2,&local_108.coordinates_);
        if (local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_d8.view_ = local_68.current.view_;
        local_d8.pointer_ = local_68.current.pointer_;
        local_d8.index_ = local_68.current.index_;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&local_d8.coordinates_,pvVar2);
        if (local_68.current.coordinates_.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.current.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68.current.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.current.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar12 = 0x17;
        do {
          piVar8 = std::
                   reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
                   operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                              *)&local_d8);
          iVar11 = (int)uVar12;
          if (*piVar8 != piVar1[uVar12]) {
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar9,"test failed.");
            __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&local_d8);
          uVar12 = (ulong)(iVar11 - 1);
        } while (iVar11 != 0);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                  (&local_108,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
        local_68.current.index_ = local_108.index_;
        local_68.current.view_ = local_108.view_;
        local_68.current.pointer_ = local_108.pointer_;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_68.current.coordinates_,&local_108.coordinates_);
        if (local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar5 = std::operator==((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                 *)&local_d8,&local_68);
        if (!bVar5) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        if (local_68.current.coordinates_.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.current.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68.current.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.current.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_d8);
        piVar8 = std::reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                 ::operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                              *)&local_d8);
        if (*piVar8 != 0) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        if (local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        operator_delete(local_98,local_80 * 0x18);
        operator_delete(_Var6._M_current,8);
        _Var6._M_current = (unsigned_long *)operator_new(8);
        *_Var6._M_current = 0x18;
        local_a8._0_8_ = piVar1;
        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var6,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )(_Var6._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                   (allocator_type *)&local_108);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_108.index_ = 0;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.view_ = (view_pointer)0x0;
        local_108.pointer_ = (pointer)0x0;
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_108);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                  (&local_d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
        puVar4 = local_108.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar3 = local_108.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_108.view_ = local_d8.view_;
        local_108.pointer_ = local_d8.pointer_;
        local_108.index_ = local_d8.index_;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_108.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3,(long)puVar4 - (long)puVar3);
        }
        if (local_d8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar14 = 1;
        do {
          if ((local_108.view_ == (view_pointer)0x0) ||
             (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
            pcVar10 = std::runtime_error::~runtime_error;
            puVar13 = &std::runtime_error::typeinfo;
LAB_001a347f:
            __cxa_throw(plVar9,puVar13,pcVar10);
          }
          if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar9,"test failed.");
            pcVar10 = std::logic_error::~logic_error;
            puVar13 = &std::logic_error::typeinfo;
            goto LAB_001a347f;
          }
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_108);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x19);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                  (&local_d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,local_78);
        if (local_108.view_ == (view_pointer)0x0) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
        }
        else {
          if (local_d8.view_ == local_108.view_) {
            if (local_108.index_ == local_d8.index_) {
              if (local_d8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                 (&local_108);
              if ((pIVar7->view_ == (view_pointer)0x0) ||
                 ((pIVar7->view_->geometry_).size_ <= pIVar7->index_)) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
                pcVar10 = std::runtime_error::~runtime_error;
                puVar13 = &std::runtime_error::typeinfo;
LAB_001a3885:
                __cxa_throw(plVar9,puVar13,pcVar10);
              }
              if (*pIVar7->pointer_ != 0x17) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar9,"test failed.");
                pcVar10 = std::logic_error::~logic_error;
                puVar13 = &std::logic_error::typeinfo;
                goto LAB_001a3885;
              }
              if (local_108.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_98,local_80 * 0x18);
              operator_delete(_Var6._M_current,8);
              _Var6._M_current = (unsigned_long *)operator_new(0x10);
              *_Var6._M_current = 0;
              _Var6._M_current[1] = 0;
              *_Var6._M_current = 6;
              _Var6._M_current[1] = 4;
              local_a8._0_8_ = piVar1;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var6,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var6._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_108);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
              local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_108.index_ = 0;
              local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_108.view_ = (view_pointer)0x0;
              local_108.pointer_ = (pointer)0x0;
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_108)
              ;
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                        (&local_d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
              puVar4 = local_108.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              puVar3 = local_108.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_108.view_ = local_d8.view_;
              local_108.pointer_ = local_d8.pointer_;
              local_108.index_ = local_d8.index_;
              local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_d8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_d8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_d8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_d8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar3 != (pointer)0x0) {
                operator_delete(puVar3,(long)puVar4 - (long)puVar3);
              }
              if (local_d8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar14 = 1;
              do {
                if ((local_108.view_ == (view_pointer)0x0) ||
                   (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
                  pcVar10 = std::runtime_error::~runtime_error;
                  puVar13 = &std::runtime_error::typeinfo;
LAB_001a34b1:
                  __cxa_throw(plVar9,puVar13,pcVar10);
                }
                if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar9,"test failed.");
                  pcVar10 = std::logic_error::~logic_error;
                  puVar13 = &std::logic_error::typeinfo;
                  goto LAB_001a34b1;
                }
                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_108);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x19);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                        (&local_d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,
                         local_78);
              if (local_108.view_ == (view_pointer)0x0) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
              }
              else {
                if (local_d8.view_ == local_108.view_) {
                  if (local_108.index_ == local_d8.index_) {
                    if (local_d8.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                       (&local_108);
                    if ((pIVar7->view_ == (view_pointer)0x0) ||
                       ((pIVar7->view_->geometry_).size_ <= pIVar7->index_)) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.")
                      ;
                      pcVar10 = std::runtime_error::~runtime_error;
                      puVar13 = &std::runtime_error::typeinfo;
LAB_001a3933:
                      __cxa_throw(plVar9,puVar13,pcVar10);
                    }
                    if (*pIVar7->pointer_ != 0x17) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar9,"test failed.");
                      pcVar10 = std::logic_error::~logic_error;
                      puVar13 = &std::logic_error::typeinfo;
                      goto LAB_001a3933;
                    }
                    if (local_108.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    operator_delete(local_98,local_80 * 0x18);
                    operator_delete(_Var6._M_current,0x10);
                    _Var6._M_current = (unsigned_long *)operator_new(0x10);
                    *_Var6._M_current = 0;
                    _Var6._M_current[1] = 0;
                    *_Var6._M_current = 6;
                    _Var6._M_current[1] = 4;
                    local_a8._0_8_ = piVar1;
                    andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                    Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var6,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )(_Var6._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                               (allocator_type *)&local_108);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                    std::
                    reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>::
                    reverse_iterator((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                      *)&local_d8);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                              (&local_108,
                               (View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,local_78)
                    ;
                    pvVar2 = &local_68.current.coordinates_;
                    local_68.current.index_ = local_108.index_;
                    local_68.current.view_ = local_108.view_;
                    local_68.current.pointer_ = local_108.pointer_;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              (pvVar2,&local_108.coordinates_);
                    if (local_108.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    local_d8.view_ = local_68.current.view_;
                    local_d8.pointer_ = local_68.current.pointer_;
                    local_d8.index_ = local_68.current.index_;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                              (&local_d8.coordinates_,pvVar2);
                    if (local_68.current.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_68.current.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_68.current.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_68.current.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar12 = 0x17;
                    do {
                      piVar8 = std::
                               reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                               ::operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                            *)&local_d8);
                      iVar11 = (int)uVar12;
                      if (*piVar8 != piVar1[uVar12]) {
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar9,"test failed.");
                        __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                (&local_d8);
                      uVar12 = (ulong)(iVar11 - 1);
                    } while (iVar11 != 0);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                              (&local_108,
                               (View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
                    local_68.current.index_ = local_108.index_;
                    local_68.current.view_ = local_108.view_;
                    local_68.current.pointer_ = local_108.pointer_;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              (&local_68.current.coordinates_,&local_108.coordinates_);
                    if (local_108.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_108.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    bVar5 = std::operator==((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                             *)&local_d8,&local_68);
                    if (!bVar5) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar9,"test failed.");
                      __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error)
                      ;
                    }
                    if (local_68.current.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_68.current.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_68.current.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_68.current.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                              (&local_d8);
                    piVar8 = std::
                             reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                             ::operator*((reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                          *)&local_d8);
                    if (*piVar8 != 0) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar9,"test failed.");
                      __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error)
                      ;
                    }
                    if (local_d8.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    operator_delete(local_98,local_80 * 0x18);
                    operator_delete(_Var6._M_current,0x10);
                    _Var6._M_current = (unsigned_long *)operator_new(0x10);
                    *_Var6._M_current = 0;
                    _Var6._M_current[1] = 0;
                    *_Var6._M_current = 6;
                    _Var6._M_current[1] = 4;
                    local_a8._0_8_ = piVar1;
                    andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                    Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var6,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )(_Var6._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                               (allocator_type *)&local_108);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_108.index_ = 0;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_108.view_ = (view_pointer)0x0;
                    local_108.pointer_ = (pointer)0x0;
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              (&local_108);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                              (&local_d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8
                               ,0);
                    puVar4 = local_108.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    puVar3 = local_108.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    local_108.view_ = local_d8.view_;
                    local_108.pointer_ = local_d8.pointer_;
                    local_108.index_ = local_d8.index_;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         local_d8.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_d8.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    local_108.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         local_d8.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                    local_d8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_d8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_d8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    if (puVar3 != (pointer)0x0) {
                      operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                    }
                    if (local_d8.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_d8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    lVar14 = 1;
                    do {
                      if ((local_108.view_ == (view_pointer)0x0) ||
                         (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar9,"Assertion failed.");
                        pcVar10 = std::runtime_error::~runtime_error;
                        puVar13 = &std::runtime_error::typeinfo;
LAB_001a3515:
                        __cxa_throw(plVar9,puVar13,pcVar10);
                      }
                      if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar9,"test failed.");
                        pcVar10 = std::logic_error::~logic_error;
                        puVar13 = &std::logic_error::typeinfo;
                        goto LAB_001a3515;
                      }
                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                (&local_108);
                      lVar14 = lVar14 + 1;
                    } while (lVar14 != 0x19);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                              (&local_d8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_a8
                               ,local_78);
                    if (local_108.view_ == (view_pointer)0x0) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.")
                      ;
                    }
                    else {
                      if (local_d8.view_ == local_108.view_) {
                        if (local_108.index_ == local_d8.index_) {
                          if (local_d8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_d8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_d8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                   operator--(&local_108);
                          if ((pIVar7->view_ == (view_pointer)0x0) ||
                             ((pIVar7->view_->geometry_).size_ <= pIVar7->index_)) {
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar9,"Assertion failed.");
                            pcVar10 = std::runtime_error::~runtime_error;
                            puVar13 = &std::runtime_error::typeinfo;
LAB_001a3a45:
                            __cxa_throw(plVar9,puVar13,pcVar10);
                          }
                          if (*pIVar7->pointer_ != 0x17) {
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar9,"test failed.");
                            pcVar10 = std::logic_error::~logic_error;
                            puVar13 = &std::logic_error::typeinfo;
                            goto LAB_001a3a45;
                          }
                          if (local_108.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_108.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_108.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_108.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          operator_delete(local_98,local_80 * 0x18);
                          operator_delete(_Var6._M_current,0x10);
                          _Var6._M_current = (unsigned_long *)operator_new(0x18);
                          *_Var6._M_current = 0;
                          _Var6._M_current[1] = 0;
                          *_Var6._M_current = 3;
                          _Var6._M_current[1] = 4;
                          _Var6._M_current[2] = 2;
                          local_a8._0_8_ = piVar1;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8),_Var6
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var6._M_current + 3),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_108);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                          local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_108.index_ = 0;
                          local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_108.view_ = (view_pointer)0x0;
                          local_108.pointer_ = (pointer)0x0;
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    (&local_108);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_d8,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
                          puVar4 = local_108.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          puVar3 = local_108.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          local_108.view_ = local_d8.view_;
                          local_108.pointer_ = local_d8.pointer_;
                          local_108.index_ = local_d8.index_;
                          local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               local_d8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                          local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_d8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          local_108.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage =
                               local_d8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                          local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_d8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          if (puVar3 != (pointer)0x0) {
                            operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                          }
                          if (local_d8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_d8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_d8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_d8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          lVar14 = 1;
                          do {
                            if ((local_108.view_ == (view_pointer)0x0) ||
                               (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar9,"Assertion failed.");
                              pcVar10 = std::runtime_error::~runtime_error;
                              puVar13 = &std::runtime_error::typeinfo;
LAB_001a3547:
                              __cxa_throw(plVar9,puVar13,pcVar10);
                            }
                            if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar9,"test failed.");
                              pcVar10 = std::logic_error::~logic_error;
                              puVar13 = &std::logic_error::typeinfo;
                              goto LAB_001a3547;
                            }
                            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                      (&local_108);
                            lVar14 = lVar14 + 1;
                          } while (lVar14 != 0x19);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a8);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_d8,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_a8,
                                     local_78);
                          if (local_108.view_ == (view_pointer)0x0) {
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar9,"Assertion failed.");
                          }
                          else {
                            if (local_d8.view_ == local_108.view_) {
                              if (local_108.index_ == local_d8.index_) {
                                if (local_d8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_d8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_d8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                pIVar7 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>
                                         ::operator--(&local_108);
                                if ((pIVar7->view_ == (view_pointer)0x0) ||
                                   ((pIVar7->view_->geometry_).size_ <= pIVar7->index_)) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar9,"Assertion failed.");
                                  pcVar10 = std::runtime_error::~runtime_error;
                                  puVar13 = &std::runtime_error::typeinfo;
LAB_001a3af3:
                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                }
                                if (*pIVar7->pointer_ != 0x17) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar9,"test failed.");
                                  pcVar10 = std::logic_error::~logic_error;
                                  puVar13 = &std::logic_error::typeinfo;
                                  goto LAB_001a3af3;
                                }
                                if (local_108.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_108.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_108.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_108.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                operator_delete(local_98,local_80 * 0x18);
                                operator_delete(_Var6._M_current,0x18);
                                _Var6._M_current = (unsigned_long *)operator_new(0x18);
                                *_Var6._M_current = 0;
                                _Var6._M_current[1] = 0;
                                *_Var6._M_current = 3;
                                _Var6._M_current[1] = 4;
                                _Var6._M_current[2] = 2;
                                local_a8._0_8_ = piVar1;
                                andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                          ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8)
                                           ,_Var6,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),&andres::defaultOrder,
                                           &andres::defaultOrder,(allocator_type *)&local_108);
                                andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                std::
                                reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                ::reverse_iterator((
                                                  reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                                  *)&local_d8);
                                andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                Iterator(&local_108,
                                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_a8
                                         ,local_78);
                                pvVar2 = &local_68.current.coordinates_;
                                local_68.current.index_ = local_108.index_;
                                local_68.current.view_ = local_108.view_;
                                local_68.current.pointer_ = local_108.pointer_;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          (pvVar2,&local_108.coordinates_);
                                if (local_108.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_108.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_108.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_108.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                local_d8.view_ = local_68.current.view_;
                                local_d8.pointer_ = local_68.current.pointer_;
                                local_d8.index_ = local_68.current.index_;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                operator=(&local_d8.coordinates_,pvVar2);
                                if (local_68.current.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_68.current.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_68.current.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_68.current.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                uVar12 = 0x17;
                                do {
                                  piVar8 = std::
                                           reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                           ::operator*((
                                                  reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                                  *)&local_d8);
                                  iVar11 = (int)uVar12;
                                  if (*piVar8 != piVar1[uVar12]) {
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar9,"test failed.");
                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                std::logic_error::~logic_error);
                                  }
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  operator--(&local_d8);
                                  uVar12 = (ulong)(iVar11 - 1);
                                } while (iVar11 != 0);
                                andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                Iterator(&local_108,
                                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_a8
                                         ,0);
                                local_68.current.index_ = local_108.index_;
                                local_68.current.view_ = local_108.view_;
                                local_68.current.pointer_ = local_108.pointer_;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          (&local_68.current.coordinates_,&local_108.coordinates_);
                                if (local_108.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_108.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_108.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_108.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                bVar5 = std::operator==((
                                                  reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                                  *)&local_d8,&local_68);
                                if (!bVar5) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar9,"test failed.");
                                  __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                              std::logic_error::~logic_error);
                                }
                                if (local_68.current.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_68.current.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_68.current.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_68.current.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                operator++(&local_d8);
                                piVar8 = std::
                                         reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                         ::operator*((
                                                  reverse_iterator<andres::Iterator<int,_true,_std::allocator<unsigned_long>_>_>
                                                  *)&local_d8);
                                if (*piVar8 != 0) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar9,"test failed.");
                                  __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                              std::logic_error::~logic_error);
                                }
                                if (local_d8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_d8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_d8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                operator_delete(local_98,local_80 * 0x18);
                                operator_delete(_Var6._M_current,0x18);
                                _Var6._M_current = (unsigned_long *)operator_new(0x18);
                                *_Var6._M_current = 0;
                                _Var6._M_current[1] = 0;
                                *_Var6._M_current = 3;
                                _Var6._M_current[1] = 4;
                                _Var6._M_current[2] = 2;
                                local_a8._0_8_ = piVar1;
                                andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                          ((Geometry<std::allocator<unsigned_long>> *)(local_a8 + 8)
                                           ,_Var6,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 3),&andres::defaultOrder,
                                           &andres::defaultOrder,(allocator_type *)&local_108);
                                andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                local_108.index_ = 0;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_108.view_ = (view_pointer)0x0;
                                local_108.pointer_ = (pointer)0x0;
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant(&local_108);
                                andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                Iterator(&local_d8,
                                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_a8
                                         ,0);
                                puVar4 = local_108.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                puVar3 = local_108.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                local_108.view_ = local_d8.view_;
                                local_108.pointer_ = local_d8.pointer_;
                                local_108.index_ = local_d8.index_;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     local_d8.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_d8.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                                local_108.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage =
                                     local_d8.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                local_d8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                if (puVar3 != (pointer)0x0) {
                                  operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                                }
                                if (local_d8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_d8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_d8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                lVar14 = 1;
                                do {
                                  if ((local_108.view_ == (view_pointer)0x0) ||
                                     (((local_108.view_)->geometry_).size_ <= local_108.index_)) {
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar9,"Assertion failed.");
                                    pcVar10 = std::runtime_error::~runtime_error;
                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001a35ab:
                                    __cxa_throw(plVar9,puVar13,pcVar10);
                                  }
                                  if (*local_108.pointer_ != this->data_[lVar14 + -1]) {
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar9,"test failed.");
                                    pcVar10 = std::logic_error::~logic_error;
                                    puVar13 = &std::logic_error::typeinfo;
                                    goto LAB_001a35ab;
                                  }
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  operator++(&local_108);
                                  lVar14 = lVar14 + 1;
                                } while (lVar14 != 0x19);
                                andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_a8);
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                Iterator(&local_d8,
                                         (View<int,_true,_std::allocator<unsigned_long>_> *)local_a8
                                         ,local_78);
                                if (local_108.view_ == (view_pointer)0x0) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar9,"Assertion failed.");
                                }
                                else {
                                  if (local_d8.view_ == local_108.view_) {
                                    if (local_108.index_ == local_d8.index_) {
                                      if (local_d8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_d8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_d8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      pIVar7 = andres::
                                               Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                               operator--(&local_108);
                                      if ((pIVar7->view_ == (view_pointer)0x0) ||
                                         ((pIVar7->view_->geometry_).size_ <= pIVar7->index_)) {
                                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar9,"Assertion failed.");
                                        pcVar10 = std::runtime_error::~runtime_error;
                                        puVar13 = &std::runtime_error::typeinfo;
                                      }
                                      else {
                                        if (*pIVar7->pointer_ == 0x17) {
                                          if (local_108.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            operator_delete(local_108.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_108.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_108.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          }
                                          operator_delete(local_98,local_80 * 0x18);
                                          operator_delete(_Var6._M_current,0x18);
                                          return;
                                        }
                                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar9,"test failed.");
                                        pcVar10 = std::logic_error::~logic_error;
                                        puVar13 = &std::logic_error::typeinfo;
                                      }
                                      __cxa_throw(plVar9,puVar13,pcVar10);
                                    }
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar9,"test failed.");
                                    pcVar10 = std::logic_error::~logic_error;
                                    puVar13 = &std::logic_error::typeinfo;
                                    goto LAB_001a3bd3;
                                  }
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar9,"Assertion failed.");
                                }
                                pcVar10 = std::runtime_error::~runtime_error;
                                puVar13 = &std::runtime_error::typeinfo;
LAB_001a3bd3:
                                __cxa_throw(plVar9,puVar13,pcVar10);
                              }
                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar9,"test failed.");
                              pcVar10 = std::logic_error::~logic_error;
                              puVar13 = &std::logic_error::typeinfo;
                              goto LAB_001a3ac1;
                            }
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar9,"Assertion failed.");
                          }
                          pcVar10 = std::runtime_error::~runtime_error;
                          puVar13 = &std::runtime_error::typeinfo;
LAB_001a3ac1:
                          __cxa_throw(plVar9,puVar13,pcVar10);
                        }
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar9,"test failed.");
                        pcVar10 = std::logic_error::~logic_error;
                        puVar13 = &std::logic_error::typeinfo;
                        goto LAB_001a3a13;
                      }
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.")
                      ;
                    }
                    pcVar10 = std::runtime_error::~runtime_error;
                    puVar13 = &std::runtime_error::typeinfo;
LAB_001a3a13:
                    __cxa_throw(plVar9,puVar13,pcVar10);
                  }
                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar9,"test failed.");
                  pcVar10 = std::logic_error::~logic_error;
                  puVar13 = &std::logic_error::typeinfo;
                  goto LAB_001a3901;
                }
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
              }
              pcVar10 = std::runtime_error::~runtime_error;
              puVar13 = &std::runtime_error::typeinfo;
LAB_001a3901:
              __cxa_throw(plVar9,puVar13,pcVar10);
            }
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar9,"test failed.");
            pcVar10 = std::logic_error::~logic_error;
            puVar13 = &std::logic_error::typeinfo;
            goto LAB_001a3853;
          }
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
        }
        pcVar10 = std::runtime_error::~runtime_error;
        puVar13 = &std::runtime_error::typeinfo;
LAB_001a3853:
        __cxa_throw(plVar9,puVar13,pcVar10);
      }
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar9,"test failed.");
      pcVar10 = std::logic_error::~logic_error;
      puVar13 = &std::logic_error::typeinfo;
      goto LAB_001a3741;
    }
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
  }
  pcVar10 = std::runtime_error::~runtime_error;
  puVar13 = &std::runtime_error::typeinfo;
LAB_001a3741:
  __cxa_throw(plVar9,puVar13,pcVar10);
}

Assistant:

void ViewTest::iteratorAccessTest(){
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 3D
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // cosnt
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
}